

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_public.c
# Opt level: O2

nng_err nng_http_handler_alloc_directory(nng_http_handler **hp,char *uri,char *path)

{
  nng_err nVar1;
  
  nVar1 = nni_http_handler_init_directory(hp,uri,path);
  return nVar1;
}

Assistant:

nng_err
nng_http_handler_alloc_directory(
    nng_http_handler **hp, const char *uri, const char *path)
{
#ifdef NNG_SUPP_HTTP
	return (nni_http_handler_init_directory(hp, uri, path));
#else
	NNI_ARG_UNUSED(hp);
	NNI_ARG_UNUSED(uri);
	NNI_ARG_UNUSED(path);
	return (NNG_ENOTSUP);
#endif
}